

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

Variant * __thiscall Jinx::Variant::operator-=(Variant *this,Variant *right)

{
  int64_t iVar1;
  double dVar2;
  
  if (this->m_type == Integer) {
    iVar1 = GetInteger(right);
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((long)(this->field_1).m_collection.
                     super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr - iVar1);
  }
  else if (this->m_type == Number) {
    dVar2 = GetNumber(right);
    (this->field_1).m_number = (this->field_1).m_number - dVar2;
  }
  return this;
}

Assistant:

inline_t Variant & Variant::operator -= (const Variant & right)
	{
		switch (m_type)
		{
			case ValueType::Number:
				m_number -= right.GetNumber();
				break;
			case ValueType::Integer:
				m_integer -= right.GetInteger();
				break;
			default:
				break;
		}
		return *this;
	}